

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

void leb_DecodeNodeAttributeArray(leb_Node node,int attributeArraySize,float (*attributeArray) [3])

{
  float (*pafVar1) [3];
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  float dp;
  float fVar6;
  float attributeVector [3];
  lebMatrix3x3 m;
  undefined8 local_68;
  float local_60;
  float local_58 [12];
  
  if (0 < attributeArraySize) {
    local_58[0] = 1.0;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_58[4] = 1.0;
    local_58[5] = 0.0;
    local_58[6] = 0.0;
    local_58[7] = 0.0;
    local_58[8] = 1.0;
    if (0 < node.depth) {
      iVar5 = node.depth + 1;
      do {
        leb__SplittingMatrix
                  ((float (*) [3])local_58,(uint)((node.id >> (iVar5 - 2U & 0x1f) & 1) != 0));
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    uVar2 = 1;
    if (1 < attributeArraySize) {
      uVar2 = (ulong)(uint)attributeArraySize;
    }
    uVar3 = 0;
    do {
      pafVar1 = attributeArray + uVar3;
      local_60 = (*pafVar1)[2];
      local_68 = *(undefined8 *)*pafVar1;
      fVar6 = 0.0;
      lVar4 = 0;
      do {
        fVar6 = fVar6 + local_58[lVar4] * *(float *)((long)&local_68 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      (*pafVar1)[0] = fVar6;
      fVar6 = 0.0;
      lVar4 = 0;
      do {
        fVar6 = fVar6 + local_58[lVar4 + 3] * *(float *)((long)&local_68 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      (*pafVar1)[1] = fVar6;
      fVar6 = 0.0;
      lVar4 = 0;
      do {
        fVar6 = fVar6 + local_58[lVar4 + 6] * *(float *)((long)&local_68 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      (*pafVar1)[2] = fVar6;
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
    return;
  }
  __assert_fail("attributeArraySize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x4c4,"void leb_DecodeNodeAttributeArray(const leb_Node, int, float (*)[3])");
}

Assistant:

LEBDEF void
leb_DecodeNodeAttributeArray(
    const leb_Node node,
    int attributeArraySize,
    float attributeArray[][3]
) {
    LEB_ASSERT(attributeArraySize > 0);

    lebMatrix3x3 m;
    float attributeVector[3];

    leb__DecodeTransformationMatrix(node, m);

    for (int i = 0; i < attributeArraySize; ++i) {
        memcpy(attributeVector, attributeArray[i], sizeof(attributeVector));
        attributeArray[i][0] = leb__DotProduct(3, m[0], attributeVector);
        attributeArray[i][1] = leb__DotProduct(3, m[1], attributeVector);
        attributeArray[i][2] = leb__DotProduct(3, m[2], attributeVector);
    }
}